

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * BuildScript<CScript,opcodetype,CScript&,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,opcodetype *inputs_1,
                    CScript *inputs_2,opcodetype *inputs_3)

{
  long in_FS_OFFSET;
  int cnt;
  anon_class_16_2_441f04d1 local_78;
  anon_class_16_2_441f04d1 local_68;
  anon_class_16_2_441f04d1 local_58;
  anon_class_16_2_441f04d1 local_48;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  local_34 = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  local_48.ret = __return_storage_ptr__;
  local_48.cnt = &local_34;
  BuildScript<CScript,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            (&local_48,inputs);
  local_58.ret = __return_storage_ptr__;
  local_58.cnt = &local_34;
  BuildScript<CScript,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            (&local_58,inputs_1);
  local_68.ret = __return_storage_ptr__;
  local_68.cnt = &local_34;
  BuildScript<CScript,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            (&local_68,inputs_2);
  local_78.ret = __return_storage_ptr__;
  local_78.cnt = &local_34;
  BuildScript<CScript,_opcodetype,_CScript_&,_opcodetype>::anon_class_16_2_441f04d1::operator()
            (&local_78,inputs_3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}